

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxAbsNzo(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool unscaled)

{
  type_conflict5 tVar1;
  undefined7 in_register_00000011;
  int i;
  uint uVar2;
  int i_1;
  long lVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  m;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_78;
  
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  if (((int)CONCAT71(in_register_00000011,unscaled) == 0) || (this->_isScaled != true)) {
    for (lVar3 = 0;
        lVar3 < (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum; lVar3 = lVar3 + 1) {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::maxAbs(&local_78,
               (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)((this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem +
                  (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar3].idx));
      tVar1 = boost::multiprecision::operator>(&local_78,__return_storage_ptr__);
      if (tVar1) {
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
             local_78.m_backend.data._M_elems._48_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
             local_78.m_backend.data._M_elems._56_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             local_78.m_backend.data._M_elems._32_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
             local_78.m_backend.data._M_elems._40_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_78.m_backend.data._M_elems._16_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             local_78.m_backend.data._M_elems._24_8_;
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_78.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_78.m_backend.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = local_78.m_backend.exp;
        (__return_storage_ptr__->m_backend).neg = local_78.m_backend.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_78.m_backend.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_78.m_backend.prec_elem;
      }
    }
  }
  else {
    for (uVar2 = 0;
        (int)uVar2 <
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum; uVar2 = uVar2 + 1) {
      (*this->lp_scaler->_vptr_SPxScaler[0x12])(&local_78,this->lp_scaler,this,(ulong)uVar2);
      tVar1 = boost::multiprecision::operator>(&local_78,__return_storage_ptr__);
      if (tVar1) {
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
             local_78.m_backend.data._M_elems._48_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
             local_78.m_backend.data._M_elems._56_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             local_78.m_backend.data._M_elems._32_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
             local_78.m_backend.data._M_elems._40_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_78.m_backend.data._M_elems._16_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             local_78.m_backend.data._M_elems._24_8_;
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_78.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_78.m_backend.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = local_78.m_backend.exp;
        (__return_storage_ptr__->m_backend).neg = local_78.m_backend.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_78.m_backend.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_78.m_backend.prec_elem;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline
R SPxLPBase<R>::maxAbsNzo(bool unscaled) const
{
   R maxi = 0.0;

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMaxAbsUnscaled(*this, i);

         if(m > maxi)
            maxi = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).maxAbs();

         if(m > maxi)
            maxi = m;
      }
   }

   assert(maxi >= 0.0);

   return maxi;
}